

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_source.hpp
# Opt level: O3

void __thiscall
ItemSourceReward::ItemSourceReward
          (ItemSourceReward *this,uint32_t address_in_rom,string *name,uint8_t reward_id,
          string *node_id,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *hints)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ItemSource::ItemSource(&this->super_ItemSource,name,node_id,hints);
  (this->super_ItemSource)._vptr_ItemSource = (_func_int **)&PTR__ItemSource_00262720;
  this->_address_in_rom = address_in_rom;
  this->_reward_id = reward_id;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"owned by someone willing to give it to the brave","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_ItemSource)._hints,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ItemSourceReward(uint32_t address_in_rom, const std::string& name, uint8_t reward_id, const std::string& node_id = "", const std::vector<std::string>& hints = {}) :
        ItemSource      (name, node_id, hints),
        _reward_id      (reward_id),
        _address_in_rom (address_in_rom)
    {
        this->add_hint("owned by someone willing to give it to the brave");
    }